

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

char * lys_path(lys_node *node)

{
  char *__string;
  uint8_t *puVar1;
  char *__src;
  char *pcVar2;
  LY_ERR *pLVar3;
  uint16_t local_2a [4];
  uint16_t index;
  
  __string = ly_buf();
  local_2a[0] = 0x3ff;
  if (node == (lys_node *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    pcVar2 = (char *)0x0;
    ly_log(LY_LLERR,"%s: NULL node parameter","lys_path");
  }
  else {
    puVar1 = ly_buf_used_location();
    if ((*puVar1 == '\0') || (*__string == '\0')) {
      __src = (char *)0x0;
    }
    else {
      __src = strndup(__string,0x3ff);
    }
    puVar1 = ly_buf_used_location();
    *puVar1 = *puVar1 + '\x01';
    __string[0x3ff] = '\0';
    ly_vlog_build_path_reverse(LY_VLOG_LYS,node,__string,local_2a,0);
    pcVar2 = strdup(__string + local_2a[0]);
    if (__src != (char *)0x0) {
      strcpy(__string,__src);
      free(__src);
    }
    puVar1 = ly_buf_used_location();
    *puVar1 = *puVar1 + 0xff;
  }
  return pcVar2;
}

Assistant:

API char *
lys_path(const struct lys_node *node)
{
    char *buf_backup = NULL, *buf = ly_buf(), *result = NULL;
    uint16_t index = LY_BUF_SIZE - 1;

    if (!node) {
        LOGERR(LY_EINVAL, "%s: NULL node parameter", __func__);
        return NULL;
    }

    /* backup the shared internal buffer */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    /* build the path */
    buf[index] = '\0';
    ly_vlog_build_path_reverse(LY_VLOG_LYS, node, buf, &index, 0);
    result = strdup(&buf[index]);

    /* restore the shared internal buffer */
    if (buf_backup) {
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return result;
}